

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Vector<float,_3>_>::genFixeds
          (DefaultSampling<tcu::Vector<float,_3>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *dst)

{
  float fVar1;
  int i;
  long lVar2;
  ulong uVar3;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_48;
  Vector<float,_3> local_24;
  
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_48);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      fVar1 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      lVar2 = 0;
      do {
        local_24.m_data[lVar2] = fVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)dst,&local_24)
      ;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}